

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O3

void __thiscall
solitaire::colliders::StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test::
StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test
          (StockPileColliderTests_thirteenUncoveredCardsCollidesWith_Test *this)

{
  StockPileMock *this_00;
  
  testing::Test::Test((Test *)this);
  (this->super_StockPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__StockPileColliderTests_003206a0;
  this_00 = &(this->super_StockPileColliderTests).stockPileMock;
  piles::StockPileMock::StockPileMock(this_00);
  StockPileCollider::StockPileCollider
            (&(this->super_StockPileColliderTests).collider,&this_00->super_StockPile);
  (this->super_StockPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__StockPileColliderTests_003204c0;
  return;
}

Assistant:

TEST_F(StockPileColliderTests, thirteenUncoveredCardsCollidesWith) {
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillRepeatedly(Return(12));

    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsPosition + Position {pileCardsSpacing * 2 - 1, 0}));
    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsPosition + Position {pileCardsSpacing * 2, -1}));
    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsBottomRightCorner + Position {pileCardsSpacing * 2 + 1, 0}));
    EXPECT_FALSE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsBottomRightCorner + Position {pileCardsSpacing * 2, 1}));
    EXPECT_TRUE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsPosition + Position {pileCardsSpacing * 2, 0}));
    EXPECT_TRUE(collider.uncoveredCardsCollidesWith(
        pileUncoveredCardsBottomRightCorner + Position {pileCardsSpacing * 2, 0}));
}